

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_OpdatasetGetActive_Test::TestBody
          (InterpreterTestSuite_PC_OpdatasetGetActive_Test *this)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *this_00;
  PersistentStorage *pPVar3;
  MatcherInterface<ot::commissioner::ActiveOperationalDataset_&> *pMVar4;
  undefined8 uVar5;
  size_type sVar6;
  json_value jVar7;
  element_type *peVar8;
  bool bVar9;
  int iVar10;
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *pTVar11;
  reference this_01;
  _Manager_operation __op;
  char *pcVar13;
  pointer *__ptr;
  _func_int *message;
  pointer pbVar14;
  _func_int **message_00;
  char *expected_predicate_value;
  initializer_list<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>
  __l;
  _Any_data local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  string jsonStr;
  undefined1 local_368 [8];
  _Alloc_hider local_360;
  long local_358;
  undefined1 local_350 [16];
  _Alloc_hider local_340;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_338;
  element_type local_330 [2];
  NetworkId nwk_id;
  json json;
  _Any_data local_2f8;
  code *local_2e8;
  code *pcStack_2e0;
  Matcher<ot::commissioner::ActiveOperationalDataset_&> local_2d0;
  Value value;
  Matcher<unsigned_short> local_268;
  undefined8 local_250;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_248;
  undefined8 local_240;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  Network nwk;
  _Any_data local_1c8;
  code *local_1b8;
  undefined8 uStack_1b0;
  string local_1a8;
  Error local_188;
  TestContext ctx;
  _Alloc_hider _Var12;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&nwk_id);
  pPVar3 = (ctx.mRegistry)->mStorage;
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&local_3a8,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&local_2f8,0xffffffff);
  psVar1 = &value.mError.mMessage._M_string_length;
  value.mError._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&value,"");
  pcVar13 = "";
  local_368 = (undefined1  [8])&local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"","");
  expected_predicate_value = (char *)0x0;
  ot::commissioner::persistent_storage::Network::Network
            (&nwk,(NetworkId *)&local_3a8,(DomainId *)&local_2f8,(string *)&value,1,0,0,
             (string *)local_368,0);
  iVar10 = (*pPVar3->_vptr_PersistentStorage[6])(pPVar3,&nwk,&nwk_id);
  json.m_type = (value_t)iVar10;
  local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase =
       (_func_int **)
       ((ulong)local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.
               _vptr_MatcherBase & 0xffffffffffffff00);
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)&jsonStr,
             "ctx.mRegistry->mStorage->Add(Network{EMPTY_ID, EMPTY_ID, \"\", 1, 0, 0, \"\", 0}, nwk_id)"
             ,"PersistentStorage::Status::kSuccess",&json.m_type,(Status *)&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
    operator_delete(nwk.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mName._M_dataplus._M_p != &nwk.mName.field_2) {
    operator_delete(nwk.mName._M_dataplus._M_p);
  }
  if (local_368 != (undefined1  [8])&local_358) {
    operator_delete((void *)local_368);
  }
  if ((size_type *)value.mError._0_8_ != psVar1) {
    operator_delete((void *)value.mError._0_8_);
  }
  if ((char)jsonStr._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&nwk);
    if (jsonStr._M_string_length != 0) {
      pcVar13 = *(char **)jsonStr._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76c,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)&nwk);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (nwk._0_8_ != 0) {
      (**(code **)(*(long *)nwk._0_8_ + 8))();
    }
  }
  if (jsonStr._M_string_length != 0) {
    if (*(void **)jsonStr._M_string_length != (void *)(jsonStr._M_string_length + 0x10)) {
      operator_delete(*(void **)jsonStr._M_string_length);
    }
    operator_delete((void *)jsonStr._M_string_length);
  }
  ot::commissioner::persistent_storage::Network::Network(&nwk);
  iVar10 = (*(ctx.mRegistry)->mStorage->_vptr_PersistentStorage[0xe])
                     ((ctx.mRegistry)->mStorage,&nwk_id,&nwk);
  local_368[0] = (internal)(char)iVar10;
  jsonStr._M_dataplus._M_p = jsonStr._M_dataplus._M_p & 0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)&value,"ctx.mRegistry->mStorage->Get(nwk_id, nwk)",
             "PersistentStorage::Status::kSuccess",local_368,(Status *)&jsonStr);
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)local_368);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&jsonStr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76e,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&jsonStr,(Message *)local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&jsonStr);
    if (local_368 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_368 + 8))();
    }
  }
  _Var12._M_p = value.mError.mMessage._M_dataplus._M_p;
  if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*value.mError.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var12._M_p);
  }
  ot::commissioner::utils::Hex<unsigned_short>((string *)&value,nwk.mPan);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            ((internal *)local_368,"utils::Hex(nwk.mPan)","\"0x0000\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
             (char (*) [7])"0x0000");
  if ((size_type *)value.mError._0_8_ != psVar1) {
    operator_delete((void *)value.mError._0_8_);
  }
  if (local_368[0] == (internal)0x0) {
    testing::Message::Message((Message *)&value);
    if ((_func_int **)local_360._M_p == (_func_int **)0x0) {
      message = (_func_int *)0x2ff875;
    }
    else {
      message = *(_func_int **)local_360._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&jsonStr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76f,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&jsonStr,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&jsonStr);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
  }
  if ((_func_int **)local_360._M_p != (_func_int **)0x0) {
    if (*(_func_int ***)local_360._M_p != (_func_int **)(local_360._M_p + 0x10)) {
      operator_delete(*(_func_int ***)local_360._M_p);
    }
    operator_delete(local_360._M_p);
  }
  local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_0039dbe8;
  local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00398250;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset&>const*>
            (&local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00398208;
  local_268.super_MatcherBase<unsigned_short>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((local_268.super_MatcherBase<unsigned_short>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_00399670;
  local_268.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00396a78;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
            (&local_268.super_MatcherBase<unsigned_short>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_268.super_MatcherBase<unsigned_short>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_268.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00396a30;
  CommissionerAppMock::gmock_GetActiveDataset
            ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              *)local_368,
             ctx.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_2d0,
             &local_268);
  testing::internal::GetWithoutMatchers();
  pTVar11 = testing::internal::
            MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
            ::InternalExpectedAt
                      ((MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                        *)local_368,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x771,"*ctx.mDefaultCommissionerObject","GetActiveDataset(_, _)");
  pTVar11 = testing::internal::
            TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
            ::Times(pTVar11,2);
  paVar2 = &local_188.mMessage.field_2;
  local_188.mCode = kNone;
  local_188.mMessage._M_string_length = 0;
  local_188.mMessage.field_2._M_local_buf[0] = '\0';
  local_188.mMessage._M_dataplus._M_p = (pointer)paVar2;
  testing::Return<ot::commissioner::Error>((testing *)&local_250,&local_188);
  local_240 = local_250;
  local_238 = local_248;
  if (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_248->_M_use_count = local_248->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_248->_M_use_count = local_248->_M_use_count + 1;
    }
  }
  jsonStr._M_dataplus._M_p = (pointer)0x0;
  jsonStr._M_string_length = 0;
  jsonStr.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1907:42)>
       ::_M_manager;
  jsonStr.field_2._8_8_ =
       std::
       _Function_handler<void_(ot::commissioner::ActiveOperationalDataset_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1907:42)>
       ::_M_invoke;
  std::function<void_(ot::commissioner::ActiveOperationalDataset_&)>::function
            ((function<void_(ot::commissioner::ActiveOperationalDataset_&)> *)&local_3a8,
             (function<void_(ot::commissioner::ActiveOperationalDataset_&)> *)&jsonStr);
  local_2e8 = (code *)0x0;
  pcStack_2e0 = (code *)0x0;
  local_2f8._M_unused._M_object = (void *)0x0;
  local_2f8._8_8_ = 0;
  local_2f8._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_2f8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_2f8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_2f8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_2f8._M_unused._0_8_ + 0x18) = local_398._8_8_;
  if (local_398._M_allocated_capacity != 0) {
    *(undefined4 *)local_2f8._M_unused._0_8_ = local_3a8._0_4_;
    *(undefined4 *)((long)local_2f8._M_unused._0_8_ + 4) = local_3a8._4_4_;
    *(undefined4 *)((long)local_2f8._M_unused._0_8_ + 8) = local_3a8._8_4_;
    *(undefined4 *)((long)local_2f8._M_unused._0_8_ + 0xc) = local_3a8._12_4_;
    *(size_type *)((long)local_2f8._M_unused._0_8_ + 0x10) = local_398._M_allocated_capacity;
  }
  local_2f8._8_8_ = 0;
  local_2e8 = std::_Function_handler::operator_cast_to_Action;
  pcStack_2e0 = std::_Function_handler::operator_cast_to_Action;
  if (jsonStr.field_2._M_allocated_capacity != 0) {
    (*(code *)jsonStr.field_2._M_allocated_capacity)(&jsonStr,&jsonStr,3);
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&local_2f8;
  std::
  vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
  ::vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
            *)&value,__l,(allocator_type *)&jsonStr);
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,3);
  }
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              *)&value.mError.mMessage.field_2,(ReturnAction *)&local_240);
  json.m_type = null;
  json._1_7_ = 0;
  json.m_value.object = (object_t *)0x0;
  json._0_8_ = operator_new(0x38);
  _Var12 = value.mData._M_dataplus;
  *(undefined8 *)json._0_8_ = value.mError._0_8_;
  *(pointer *)(json._0_8_ + 8) = value.mError.mMessage._M_dataplus._M_p;
  *(size_type *)(json._0_8_ + 0x10) = value.mError.mMessage._M_string_length;
  value.mError.mMessage._M_string_length = 0;
  value.mError.mCode = kNone;
  value.mError._4_4_ = 0;
  value.mError.mMessage._M_dataplus._M_p = (pointer)0x0;
  *(undefined8 *)(json._0_8_ + 0x28) = 0;
  *(undefined8 *)(json._0_8_ + 0x18) = 0;
  *(undefined8 *)(json._0_8_ + 0x20) = 0;
  *(size_type *)(json._0_8_ + 0x30) = value.mData._M_string_length;
  if (value.mData._M_dataplus._M_p != (pointer)0x0) {
    *(ulong *)(json._0_8_ + 0x18) =
         CONCAT71(value.mError.mMessage.field_2._M_allocated_capacity._1_7_,
                  value.mError.mMessage.field_2._M_local_buf[0]);
    *(undefined8 *)(json._0_8_ + 0x20) = value.mError.mMessage.field_2._8_8_;
    *(pointer *)(json._0_8_ + 0x28) = value.mData._M_dataplus._M_p;
    value.mData._M_dataplus._M_p = (pointer)0x0;
    value.mData._M_string_length = 0;
  }
  json.m_value.object = (object_t *)0x0;
  std::
  vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
  ::~vector((vector<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>,_std::allocator<testing::Action<void_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>_>_>
             *)&value);
  __op = (_Manager_operation)_Var12._M_p;
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  ::WillRepeatedly(pTVar11,(Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                            *)&json);
  std::_Function_handler::operator_cast_to_Action
            ((_Function_handler *)&json,(_Any_data *)&json,(_Any_data *)0x3,__op);
  if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238);
  }
  if (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.mMessage._M_dataplus._M_p != paVar2) {
    operator_delete(local_188.mMessage._M_dataplus._M_p);
  }
  local_350._8_8_ = &PTR__MatcherBase_00398250;
  if (local_338._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_338._M_pi);
  }
  local_360._M_p = (pointer)&PTR__MatcherBase_00396a78;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350._0_8_);
  }
  local_268.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00396a78;
  if (local_268.super_MatcherBase<unsigned_short>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.super_MatcherBase<unsigned_short>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00398250;
  if (local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_2e8 = (code *)0x0;
  local_2f8._M_unused._M_object = (pointer)0x0;
  local_2f8._8_8_ = 0;
  paVar2 = &value.mData.field_2;
  value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
  value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
  value.mError.mMessage._M_string_length = 0;
  value.mError.mMessage.field_2._M_local_buf[0] = '\0';
  value.mData._M_string_length = 0;
  value.mData.field_2._M_local_buf[0] = '\0';
  local_368 = (undefined1  [8])&local_358;
  value.mData._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"opdataset get active","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_3a8,&ctx.mInterpreter,(string *)local_368);
  jsonStr.field_2._M_allocated_capacity = (size_type)local_2e8;
  jsonStr._M_string_length = local_2f8._8_8_;
  jsonStr._M_dataplus._M_p = (pointer)local_2f8._M_unused._0_8_;
  local_2e8 = (code *)local_398._M_allocated_capacity;
  local_2f8._M_unused._M_object = local_3a8._M_unused._M_object;
  local_2f8._8_8_ = local_3a8._8_8_;
  local_3a8._M_unused._M_object = (long *)0x0;
  local_3a8._8_8_ = 0;
  local_398._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&jsonStr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_3a8);
  if (local_368 != (undefined1  [8])&local_358) {
    operator_delete((void *)local_368);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_368,&ctx.mInterpreter,(Expression *)&local_2f8)
  ;
  this_00 = &value.mError.mMessage;
  value.mError.mCode = local_368._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_360);
  std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_340);
  if ((element_type *)local_340._M_p != local_330) {
    operator_delete(local_340._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350) {
    operator_delete(local_360._M_p);
  }
  bVar9 = ot::commissioner::Interpreter::Value::HasNoError(&value);
  jsonStr._M_dataplus._M_p._0_1_ = bVar9;
  jsonStr._M_string_length = 0;
  if (!bVar9) {
    testing::Message::Message((Message *)&local_3a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_368,(internal *)&jsonStr,(AssertionResult *)0x2ddeee,"false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&json,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x780,(char *)local_368);
    testing::internal::AssertHelper::operator=((AssertHelper *)&json,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&json);
    if (local_368 != (undefined1  [8])&local_358) {
      operator_delete((void *)local_368);
    }
    if ((long *)local_3a8._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_3a8._M_unused._M_object + 8))();
    }
    sVar6 = jsonStr._M_string_length;
    if (jsonStr._M_string_length != 0) {
      if (*(void **)jsonStr._M_string_length != (void *)(jsonStr._M_string_length + 0x10)) {
        operator_delete(*(void **)jsonStr._M_string_length);
      }
      operator_delete((void *)sVar6);
    }
  }
  iVar10 = (*(ctx.mRegistry)->mStorage->_vptr_PersistentStorage[0xe])
                     ((ctx.mRegistry)->mStorage,&nwk_id,&nwk);
  jsonStr._M_dataplus._M_p._0_1_ = (char)iVar10;
  local_3a8._M_unused._M_member_pointer = local_3a8._M_unused._M_member_pointer & 0xffffffffffffff00
  ;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::PersistentStorage::Status,ot::commissioner::persistent_storage::PersistentStorage::Status>
            ((internal *)local_368,"ctx.mRegistry->mStorage->Get(nwk_id, nwk)",
             "PersistentStorage::Status::kSuccess",(Status *)&jsonStr,
             (Status *)local_3a8._M_pod_data);
  if (local_368[0] == (internal)0x0) {
    testing::Message::Message((Message *)&jsonStr);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_p ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_360._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x782,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)&jsonStr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (jsonStr._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)jsonStr._M_dataplus._M_p + 8))();
    }
  }
  _Var12._M_p = local_360._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_360._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_360._M_p + 0x10)) {
      operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_360._M_p);
    }
    operator_delete(_Var12._M_p);
  }
  jsonStr._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_368,"nwk.mPan","0x0001",&nwk.mPan,(int *)&jsonStr);
  if (local_368[0] == (internal)0x0) {
    testing::Message::Message((Message *)&jsonStr);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_p ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_360._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x783,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)&jsonStr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (jsonStr._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)jsonStr._M_dataplus._M_p + 8))();
    }
  }
  _Var12._M_p = local_360._M_p;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_360._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_360._M_p + 0x10)) {
      operator_delete(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_360._M_p);
    }
    operator_delete(_Var12._M_p);
  }
  local_368 = (undefined1  [8])&local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_368,"opdataset get active --export ./tmp/aods.json","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_3a8,&ctx.mInterpreter,(string *)local_368);
  jsonStr.field_2._M_allocated_capacity = (size_type)local_2e8;
  jsonStr._M_string_length = local_2f8._8_8_;
  jsonStr._M_dataplus._M_p = (pointer)local_2f8._M_unused._0_8_;
  local_2e8 = (code *)local_398._M_allocated_capacity;
  local_2f8._M_unused._M_object = local_3a8._M_unused._M_object;
  local_2f8._8_8_ = local_3a8._8_8_;
  local_3a8._M_unused._M_object = (long *)0x0;
  local_3a8._8_8_ = 0;
  local_398._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&jsonStr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_3a8);
  if (local_368 != (undefined1  [8])&local_358) {
    operator_delete((void *)local_368);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_368,&ctx.mInterpreter,(Expression *)&local_2f8)
  ;
  value.mError.mCode = local_368._0_4_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_360);
  std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_340);
  if ((element_type *)local_340._M_p != local_330) {
    operator_delete(local_340._M_p);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350) {
    operator_delete(local_360._M_p);
  }
  bVar9 = ot::commissioner::Interpreter::Value::HasNoError(&value);
  jsonStr._M_dataplus._M_p._0_1_ = bVar9;
  jsonStr._M_string_length = 0;
  if (!bVar9) {
    testing::Message::Message((Message *)&local_3a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_368,(internal *)&jsonStr,(AssertionResult *)0x2ddeee,"false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&json,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x787,(char *)local_368);
    testing::internal::AssertHelper::operator=((AssertHelper *)&json,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&json);
    if (local_368 != (undefined1  [8])&local_358) {
      operator_delete((void *)local_368);
    }
    if ((long *)local_3a8._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_3a8._M_unused._M_object + 8))();
    }
    sVar6 = jsonStr._M_string_length;
    if (jsonStr._M_string_length != 0) {
      if (*(void **)jsonStr._M_string_length != (void *)(jsonStr._M_string_length + 0x10)) {
        operator_delete(*(void **)jsonStr._M_string_length);
      }
      operator_delete((void *)sVar6);
    }
  }
  ot::commissioner::Interpreter::PrintOrExport(&ctx.mInterpreter,&value);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"./tmp/aods.json","");
  ot::commissioner::PathExists((Error *)local_368,&local_1a8);
  local_3a8._0_4_ = local_368._0_4_;
  json._0_8_ = json._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&jsonStr,"PathExists(\"./tmp/aods.json\").GetCode()","ErrorCode::kNone",
             (ErrorCode *)local_3a8._M_pod_data,(ErrorCode *)&json);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350) {
    operator_delete(local_360._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((char)jsonStr._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_368);
    if (jsonStr._M_string_length == 0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)jsonStr._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x789,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (local_368 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_368 + 8))();
    }
  }
  sVar6 = jsonStr._M_string_length;
  if (jsonStr._M_string_length != 0) {
    if (*(void **)jsonStr._M_string_length != (void *)(jsonStr._M_string_length + 0x10)) {
      operator_delete(*(void **)jsonStr._M_string_length);
    }
    operator_delete((void *)sVar6);
  }
  jsonStr._M_string_length = 0;
  jsonStr.field_2._M_allocated_capacity = jsonStr.field_2._M_allocated_capacity & 0xffffffffffffff00
  ;
  local_3a8._M_unused._M_object = &local_398;
  jsonStr._M_dataplus._M_p = (pointer)&jsonStr.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"./tmp/aods.json","");
  ot::commissioner::ReadFile((Error *)local_368,&jsonStr,(string *)&local_3a8);
  local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase =
       (_func_int **)
       CONCAT44(local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.
                _vptr_MatcherBase._4_4_,local_368._0_4_);
  local_268.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)
       ((ulong)local_268.super_MatcherBase<unsigned_short>._vptr_MatcherBase & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&json,"ReadFile(jsonStr, \"./tmp/aods.json\").GetCode()","ErrorCode::kNone"
             ,(ErrorCode *)&local_2d0,(ErrorCode *)&local_268);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_350) {
    operator_delete(local_360._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_unused._0_8_ != &local_398) {
    operator_delete(local_3a8._M_unused._M_object);
  }
  if (json.m_type == null) {
    testing::Message::Message((Message *)local_368);
    if (json.m_value.object == (object_t *)0x0) {
      pbVar14 = (pointer)0x2ff875;
    }
    else {
      pbVar14 = ((json.m_value.array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78c,(char *)pbVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (local_368 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_368 + 8))();
    }
  }
  jVar7 = json.m_value;
  if (json.m_value.object != (object_t *)0x0) {
    pbVar14 = ((json.m_value.array)->
              super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar14 !=
        (pointer)&((json.m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete(pbVar14);
    }
    operator_delete(jVar7.object);
  }
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((input_adapter *)local_368,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )jsonStr._M_dataplus._M_p,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(jsonStr._M_dataplus._M_p + jsonStr._M_string_length));
  local_1b8 = (code *)0x0;
  uStack_1b0 = 0;
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&json,(input_adapter *)local_368,(parser_callback_t *)&local_1c8,true);
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_360._M_p);
  }
  bVar9 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::contains<const_char_(&)[6],_0>(&json,(char (*) [6])0x2e2462);
  local_3a8._M_pod_data[0] = bVar9;
  local_3a8._8_8_ = (undefined8 *)0x0;
  if (!bVar9) {
    testing::Message::Message((Message *)&local_2d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_368,(internal *)local_3a8._M_pod_data,
               (AssertionResult *)"json.contains(\"PanId\")","false","true",expected_predicate_value
              );
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78e,(char *)local_368);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_368 != (undefined1  [8])&local_358) {
      operator_delete((void *)local_368);
    }
    if (local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase
        != (_func_int **)0x0) {
      (**(code **)(*local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.
                    _vptr_MatcherBase + 8))();
    }
    uVar5 = local_3a8._8_8_;
    if ((undefined8 *)local_3a8._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_3a8._8_8_ != (undefined8 *)(local_3a8._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_3a8._8_8_);
      }
      operator_delete((void *)uVar5);
    }
  }
  local_3a8._M_unused._M_object = &local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"PanId","");
  this_01 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at(&json,(key_type *)&local_3a8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,this_01)
  ;
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2d0,"\"0x0001\"","json.at(\"PanId\").get<std::string>().c_str()",
             "0x0001",(char *)local_368);
  if (local_368 != (undefined1  [8])&local_358) {
    operator_delete((void *)local_368);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_unused._0_8_ != &local_398) {
    operator_delete(local_3a8._M_unused._M_object);
  }
  if (local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>._vptr_MatcherBase.
      _0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_368);
    if (local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (MatcherInterface<ot::commissioner::ActiveOperationalDataset_&> *)0x0) {
      message_00 = (_func_int **)0x2ff875;
    }
    else {
      message_00 = ((local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_
                     .
                     super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78f,(char *)message_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3a8,(Message *)local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3a8);
    if (local_368 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_368 + 8))();
    }
  }
  peVar8 = local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (MatcherInterface<ot::commissioner::ActiveOperationalDataset_&> *)0x0) {
    pMVar4 = (MatcherInterface<ot::commissioner::ActiveOperationalDataset_&> *)
             ((local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    if (pMVar4 != local_2d0.super_MatcherBase<ot::commissioner::ActiveOperationalDataset_&>.impl_.
                  super___shared_ptr<const_testing::MatcherInterface<ot::commissioner::ActiveOperationalDataset_&>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr + 2) {
      operator_delete(pMVar4);
    }
    operator_delete(peVar8);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&json);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&json.m_value.boolean,json.m_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)jsonStr._M_dataplus._M_p != &jsonStr.field_2) {
    operator_delete(jsonStr._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value.mData._M_dataplus._M_p != paVar2) {
    operator_delete(value.mData._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value.mError.mMessage._M_dataplus._M_p != &value.mError.mMessage.field_2) {
    operator_delete(value.mError.mMessage._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mMlp._M_dataplus._M_p != &nwk.mMlp.field_2) {
    operator_delete(nwk.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nwk.mName._M_dataplus._M_p != &nwk.mName.field_2) {
    operator_delete(nwk.mName._M_dataplus._M_p);
  }
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_OpdatasetGetActive)
{
    TestContext ctx;
    InitContext(ctx);

    NetworkId nwk_id;
    EXPECT_EQ(ctx.mRegistry->mStorage->Add(Network{EMPTY_ID, EMPTY_ID, "", 1, 0, 0, "", 0}, nwk_id),
              PersistentStorage::Status::kSuccess);
    Network nwk;
    EXPECT_EQ(ctx.mRegistry->mStorage->Get(nwk_id, nwk), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(utils::Hex(nwk.mPan), "0x0000");

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetActiveDataset(_, _))
        .Times(2)
        .WillRepeatedly(DoAll(WithArg<0>([](ActiveOperationalDataset &a) {
                                  a.mExtendedPanId = ByteArray{0, 0, 0, 0, 0, 0, 0, 1};
                                  a.mPanId         = 1;
                                  a.mPresentFlags =
                                      ActiveOperationalDataset::kPanIdBit | ActiveOperationalDataset::kExtendedPanIdBit;
                              }),
                              Return(Error{})));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("opdataset get active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_EQ(ctx.mRegistry->mStorage->Get(nwk_id, nwk), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nwk.mPan, 0x0001);

    expr  = ctx.mInterpreter.ParseExpression("opdataset get active --export ./tmp/aods.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    ctx.mInterpreter.PrintOrExport(value);
    EXPECT_EQ(PathExists("./tmp/aods.json").GetCode(), ErrorCode::kNone);

    std::string jsonStr;
    EXPECT_EQ(ReadFile(jsonStr, "./tmp/aods.json").GetCode(), ErrorCode::kNone);
    nlohmann::json json = nlohmann::json::parse(jsonStr);
    EXPECT_TRUE(json.contains("PanId"));
    EXPECT_STREQ("0x0001", json.at("PanId").get<std::string>().c_str());
}